

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printMemRegImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  _Bool _Var4;
  MCOperand *pMVar5;
  int64_t iVar6;
  ulong uVar7;
  char *fmt;
  uint uVar8;
  ushort uVar9;
  
  set_mem_access(MI,true);
  pMVar5 = MCInst_getOperand(MI,OpNo);
  _Var4 = MCOperand_isImm(pMVar5);
  if (_Var4) {
    pMVar5 = MCInst_getOperand(MI,OpNo);
    iVar6 = MCOperand_getImm(pMVar5);
    uVar9 = (ushort)iVar6;
    uVar8 = (uint)(short)uVar9;
    if ((short)uVar9 < 0) {
      uVar3 = -uVar8;
      if (uVar9 < 0xfff7) {
        fmt = "-0x%x";
      }
      else {
        fmt = "-%u";
      }
    }
    else {
      uVar3 = uVar8;
      if (uVar9 < 10) {
        fmt = "%u";
      }
      else {
        fmt = "0x%x";
      }
    }
    SStream_concat(O,fmt,(ulong)uVar3);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      uVar7 = (ulong)(pcVar2->field_6).x86.addr_size;
      if (MI->csh->doing_mem == true) {
        *(uint *)(pcVar2->groups + uVar7 * 0x18 + 0x29) = uVar8;
      }
      else {
        puVar1 = pcVar2->groups + uVar7 * 0x18 + 0x1d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.addr_size * 0x18 + 0x25) =
             (long)(short)uVar9;
        puVar1 = &(MI->flat_insn->detail->field_6).x86.addr_size;
        *puVar1 = *puVar1 + '\x01';
      }
    }
  }
  else {
    printOperand(MI,OpNo,O);
  }
  SStream_concat0(O,"(");
  pMVar5 = MCInst_getOperand(MI,OpNo + 1);
  uVar8 = MCOperand_getReg(pMVar5);
  if (uVar8 == 0x55) {
    SStream_concat0(O,"0");
  }
  else {
    printOperand(MI,OpNo + 1,O);
  }
  SStream_concat0(O,")");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printMemRegImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	set_mem_access(MI, true);

	printS16ImmOperand_Mem(MI, OpNo, O);

	SStream_concat0(O, "(");

	if (MCOperand_getReg(MCInst_getOperand(MI, OpNo + 1)) == PPC_R0)
		SStream_concat0(O, "0");
	else
		printOperand(MI, OpNo + 1, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}